

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4m.cpp
# Opt level: O2

bool ReadD4M(MemFile *file,shared_ptr<Disk> *disk)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Disk *pDVar3;
  bool bVar4;
  int iVar5;
  ssize_t sVar6;
  Data *data;
  size_t in_RCX;
  FILE *__stream;
  undefined1 auVar7 [16];
  Format local_164;
  uint8_t ab [256];
  
  iVar5 = MemFile::size(file);
  if ((iVar5 == 0x32a000) && (bVar4 = MemFile::seek(file,0x320800), bVar4)) {
    sVar6 = MemFile::read(file,(int)ab,(void *)0x100,in_RCX);
    if ((char)sVar6 == '\0') {
      return false;
    }
    if (ab._0_2_ != 0x101) {
      return false;
    }
    auVar7[0] = -(ab[5] == 'S');
    auVar7[1] = -(ab[6] == 'Y');
    auVar7[2] = -(ab[7] == 'S');
    auVar7[3] = -(ab[8] == 'T');
    auVar7[4] = -(ab[9] == 'E');
    auVar7[5] = -(ab[10] == 'M');
    auVar7[6] = -(ab[0xb] == 0xa0);
    auVar7[7] = -(ab[0xc] == 0xa0);
    auVar7[8] = -(ab[0xd] == 0xa0);
    auVar7[9] = -(ab[0xe] == 0xa0);
    auVar7[10] = -(ab[0xf] == 0xa0);
    auVar7[0xb] = -(ab[0x10] == 0xa0);
    auVar7[0xc] = -(ab[0x11] == 0xa0);
    auVar7[0xd] = -(ab[0x12] == 0xa0);
    auVar7[0xe] = -(ab[0x13] == 0xa0);
    auVar7[0xf] = -(ab[0x14] == 0xa0);
    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) | (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe | (ushort)(auVar7[0xf] >> 7) << 0xf)
        == 0xffff) {
      __stream = (FILE *)0x18;
      Format::Format(&local_164,D4M);
      MemFile::rewind(file,__stream);
      iVar5 = local_164.head1;
      local_164.head1 = local_164.head0;
      local_164.head0 = iVar5;
      pDVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      data = MemFile::data(file);
      Disk::format(pDVar3,&local_164,data,false);
      pDVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar1 = (pDVar3->fmt).head0;
      uVar2 = (pDVar3->fmt).head1;
      (pDVar3->fmt).head0 = uVar2;
      (pDVar3->fmt).head1 = uVar1;
      Disk::flip_sides(pDVar3);
      std::__cxx11::string::assign
                ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          strType);
      return true;
    }
  }
  return false;
}

Assistant:

bool ReadD4M(MemFile& file, std::shared_ptr<Disk>& disk)
{
    // D4M is a fixed-size image
    uint8_t ab[256];
    if (file.size() != D4M_DISK_SIZE || !file.seek(D4M_PARTITION_OFFSET) || !file.read(&ab, sizeof(ab)))
        return false;

    // Check a partition starts at track 1 sector 1, with "SYSTEM" name
    if (memcmp(ab, "\x01\x01", 2) || memcmp(ab + 5, "SYSTEM\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0\xa0", 16))
        return false;

    Format fmt{ RegularFormat::D4M };

    // D2M stores the sides in the reverse order, so fiddle things to read it easily
    file.rewind();
    std::swap(fmt.head0, fmt.head1);
    disk->format(fmt, file.data());
    std::swap(disk->fmt.head0, disk->fmt.head1);
    disk->flip_sides();
    disk->strType = "D4M";

    return true;
}